

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

size_t __thiscall CLI::App::count_all(App *this)

{
  Option *pOVar1;
  pointer psVar2;
  pointer pcVar3;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *opt;
  pointer puVar4;
  size_t sVar5;
  shared_ptr<CLI::App> *sub;
  pointer psVar6;
  long lVar7;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30 [16];
  
  lVar7 = 0;
  for (puVar4 = (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar4 != (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar4 = puVar4 + 1) {
    pOVar1 = (puVar4->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
             _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    lVar7 = lVar7 + ((long)*(pointer *)
                            ((long)&(pOVar1->results_).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            + 8) -
                     *(long *)&(pOVar1->results_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl >> 5);
  }
  psVar2 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar2; psVar6 = psVar6 + 1) {
    sVar5 = count_all((psVar6->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    lVar7 = lVar7 + sVar5;
  }
  pcVar3 = (this->name_)._M_dataplus._M_p;
  local_40 = local_30;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar3,pcVar3 + (this->name_)._M_string_length);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if (local_38 != 0) {
    local_38 = this->parsed_;
  }
  return local_38 + lVar7;
}

Assistant:

size_t count_all() const {
        size_t cnt{0};
        for(auto &opt : options_) {
            cnt += opt->count();
        }
        for(auto &sub : subcommands_) {
            cnt += sub->count_all();
        }
        if(!get_name().empty()) { // for named subcommands add the number of times the subcommand was called
            cnt += parsed_;
        }
        return cnt;
    }